

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O3

LY_ERR lysp_stmt_deviate(lysp_ctx *ctx,lysp_stmt *stmt,lysp_deviate **devs,lysp_ext_instance **exts)

{
  LY_ERR extraout_EAX;
  ly_ctx *ctx_00;
  
  if (ctx == (lysp_ctx *)0x0) {
    ctx_00 = (ly_ctx *)0x0;
  }
  else {
    ctx_00 = (ly_ctx *)
             **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
  }
  ly_log(ctx_00,LY_LLERR,LY_EINVAL,"Extension instance \"deviate\" substatement is not supported.");
  return extraout_EAX;
}

Assistant:

static LY_ERR
lysp_stmt_deviate(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, struct lysp_deviate **devs, struct lysp_ext_instance **exts)
{
    (void)stmt;
    (void)devs;
    (void)exts;

    /* TODO */
    LOGERR(PARSER_CTX(ctx), LY_EINVAL, "Extension instance \"deviate\" substatement is not supported.");
    return LY_EINVAL;
}